

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveTessellation.h
# Opt level: O1

pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
* __thiscall
anurbs::CurveTessellation<3L>::compute
          (pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
           *__return_storage_ptr__,CurveTessellation<3L> *this,CurveBaseD *curve,double tolerance)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  pointer pMVar4;
  undefined8 uVar5;
  pointer ppVar6;
  pointer ppVar7;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  *ppVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Interval *span;
  double *pdVar13;
  bool bVar14;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double __tmp;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  sample_points;
  vector<double,_std::allocator<double>_> parameters;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  points;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  locations;
  double t;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  local_138;
  undefined1 local_118 [16];
  pointer pdStack_108;
  double local_100;
  void *local_f8;
  void *pvStack_f0;
  long local_e8;
  value_type local_d8;
  double local_b8;
  undefined8 uStack_b0;
  double local_a0;
  pointer local_98;
  double dStack_90;
  double local_88;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  *local_80;
  pointer local_78;
  pointer local_70;
  double local_68;
  double local_60;
  double local_58;
  void *local_50;
  double local_48;
  double dStack_40;
  
  local_a0 = tolerance;
  local_80 = __return_storage_ptr__;
  dVar3 = (double)(**(code **)(*(long *)this + 0x18))(this);
  local_138.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8 = 0;
  local_f8 = (void *)0x0;
  pvStack_f0 = (void *)0x0;
  (**(code **)(*(long *)this + 0x20))(local_118,this);
  if (local_118._0_8_ != local_118._8_8_) {
    dVar16 = ABS((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - dVar3);
    uStack_b0 = 0;
    pdVar13 = (double *)local_118._0_8_;
    local_b8 = dVar16;
    do {
      pMVar4 = (pointer)((*pdVar13 - dVar3) / dVar16);
      if (1e-07 <= ABS((pdVar13[1] - dVar3) / dVar16 - (double)pMVar4)) {
        local_98 = pMVar4;
        (**(code **)(*(long *)this + 0x28))(SUB84(*pdVar13,0),&local_d8,this);
        std::
        vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
        ::emplace_back<double_const&,Eigen::Matrix<double,1,3,1,1,3>const&>
                  ((vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
                    *)&local_138,(double *)&local_98,(Matrix<double,_1,_3,_1,_1,_3> *)&local_d8);
        dVar16 = local_b8;
      }
      pdVar13 = pdVar13 + 2;
    } while (pdVar13 != (double *)local_118._8_8_);
  }
  if ((double *)local_118._0_8_ != (double *)0x0) {
    operator_delete((void *)local_118._0_8_,(long)pdStack_108 - local_118._0_8_);
  }
  local_d8.first = 1.0;
  dVar16 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - dVar3;
  (**(code **)(*(long *)this + 0x28))(SUB84(dVar3 + dVar16,0),local_118,this);
  std::
  vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
  ::emplace_back<double,Eigen::Matrix<double,1,3,1,1,3>>
            ((vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
              *)&local_138,&local_d8.first,(Matrix<double,_1,_3,_1,_1,_3> *)local_118);
  ppVar7 = local_138.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar6 = local_138.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_138.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_138.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_138.
                  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_138.
                  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar11 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>*,std::vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<anurbs::CurveTessellation<3l>::compute(anurbs::CurveBase<3l>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_138.
               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_138.
               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>*,std::vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<anurbs::CurveTessellation<3l>::compute(anurbs::CurveBase<3l>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar6,ppVar7);
  }
  lVar10 = (**(code **)(*(long *)this + 0x10))(this);
  local_68 = (double)(lVar10 * 2 + 2);
  lVar11 = lVar10 * 2 + 1;
  lVar12 = 1;
  if (1 < lVar11) {
    lVar12 = lVar11;
  }
  do {
    local_118._0_8_ =
         local_138.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].first;
    local_100 = local_138.
                super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
                [2];
    local_118._8_8_ =
         local_138.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].second.
         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0];
    pdStack_108 = (pointer)local_138.
                           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                           m_data.array[1];
    local_d8.first = (double)local_118._0_8_ * dVar16 + dVar3;
    local_138.
    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_138.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::
    vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
    ::emplace_back<double,Eigen::Matrix<double,1,3,1,1,3>const&>
              ((vector<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,3,1,1,3>>>>
                *)&local_f8,&local_d8.first,(Matrix<double,_1,_3,_1,_1,_3> *)(local_118 + 8));
    local_70 = local_138.
               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_78 = local_138.
               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_138.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_138.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    do {
      local_58 = local_138.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first;
      local_48 = local_138.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
                 [0];
      dStack_40 = local_138.
                  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                  array[1];
      local_60 = local_138.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
                 [2];
      local_d8.first = 0.0;
      if (lVar10 < 0) {
        local_b8 = 0.0;
      }
      else {
        local_b8 = 0.0;
        lVar11 = 1;
        do {
          local_50 = (void *)((local_58 - (double)local_118._0_8_) * ((double)lVar11 / local_68) +
                             (double)local_118._0_8_);
          (**(code **)(*(long *)this + 0x28))
                    (SUB84(dVar16 * (double)local_50 + dVar3,0),&local_98,this);
          dVar17 = local_48 - (double)local_118._8_8_;
          dVar18 = dStack_40 - (double)pdStack_108;
          dVar15 = local_60 - local_100;
          dVar21 = ((double)pdStack_108 - dStack_90) * dVar15 - dVar18 * (local_100 - local_88);
          dVar20 = (local_100 - local_88) * dVar17 -
                   dVar15 * ((double)local_118._8_8_ - (double)local_98);
          dVar19 = dVar18 * ((double)local_118._8_8_ - (double)local_98) -
                   dVar17 * ((double)pdStack_108 - dStack_90);
          dVar15 = SQRT(dVar19 * dVar19 + dVar20 * dVar20 + dVar21 * dVar21) /
                   SQRT(dVar15 * dVar15 + dVar18 * dVar18 + dVar17 * dVar17);
          if (local_b8 < dVar15) {
            local_d8.first = (double)local_50;
            local_d8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[0] = (double)local_98;
            local_d8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[1] = dStack_90;
            local_d8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[2] = local_88;
            local_b8 = dVar15;
          }
          bVar14 = lVar11 != lVar12;
          lVar11 = lVar11 + 1;
        } while (bVar14);
      }
    } while ((local_a0 <= local_b8) &&
            (std::
             vector<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
             ::push_back(&local_138,&local_d8), local_a0 <= local_b8));
  } while (local_70 != local_78);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_118,
             (long)pvStack_f0 - (long)local_f8 >> 5,(allocator_type *)&local_d8);
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            *)&local_d8,(long)pvStack_f0 - (long)local_f8 >> 5,(allocator_type *)&local_98);
  ppVar8 = local_80;
  if (pvStack_f0 != local_f8 && -1 < (long)pvStack_f0 - (long)local_f8) {
    lVar11 = 4;
    lVar12 = 0;
    lVar10 = 0;
    do {
      *(double *)(local_118._0_8_ + lVar10 * 8) = *(double *)((long)local_f8 + lVar12);
      puVar1 = (undefined8 *)((long)local_f8 + lVar12 + 8);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)local_d8.first + lVar11 * 4 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      *(undefined8 *)((long)local_d8.first + lVar11 * 4) =
           *(undefined8 *)((long)local_f8 + lVar12 + 0x18);
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0x20;
      lVar11 = lVar11 + 6;
    } while (lVar10 < (long)pvStack_f0 - (long)local_f8 >> 5);
  }
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::
  pair<std::vector<double,_std::allocator<double>_>_&,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_&,_true>
            (local_80,(vector<double,_std::allocator<double>_> *)local_118,
             (vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)&local_d8);
  if ((void *)local_d8.first != (void *)0x0) {
    operator_delete((void *)local_d8.first,
                    (long)local_d8.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array[1] - (long)local_d8.first);
  }
  if ((pointer)local_118._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._0_8_,(long)pdStack_108 - local_118._0_8_);
  }
  if (local_f8 != (void *)0x0) {
    operator_delete(local_f8,local_e8 - (long)local_f8);
  }
  if (local_138.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return ppVar8;
}

Assistant:

static std::pair<std::vector<double>, std::vector<Vector>> compute(const CurveBaseD& curve, const double tolerance)
    {
        const Interval domain = curve.domain();

        std::vector<ParameterPoint> sample_points;
        std::vector<ParameterPoint> points;

        // compute sample points

        for (const auto& span : curve.spans()) {
            const Interval normalized_span = domain.normalized_interval(span);

            if (normalized_span.length() < 1e-7) {
                continue;
            }

            const double t = normalized_span.t0();
            const Vector point = curve.point_at(span.t0());

            sample_points.emplace_back(t, point);
        }

        sample_points.emplace_back(1.0, curve.point_at(domain.parameter_at_normalized(1.0)));

        std::sort(std::begin(sample_points), std::end(sample_points),
            [](auto const& lhs, auto const& rhs) {
                return std::get<0>(lhs) > std::get<0>(rhs);
            });

        // compute polyline

        const Index n = curve.degree() * 2 + 1;

        while (true) {
            const auto [t_a, point_a] = sample_points.back();
            sample_points.pop_back();

            points.emplace_back(domain.parameter_at_normalized(t_a), point_a);

            if (sample_points.empty()) {
                break;
            }

            while (true) {
                const auto [t_b, point_b] = sample_points.back();

                double max_distance {0};
                ParameterPoint max_point;

                for (Index i = 1; i <= n; i++) {
                    const double t = Interval::parameter_at_normalized(t_a, t_b, i / double(n + 1));
                    const Vector point = curve.point_at(domain.parameter_at_normalized(t));

                    const double distance = distance_to_line(point, point_a, point_b);

                    if (distance > max_distance) {
                        max_distance = distance;
                        max_point = {t, point};
                    }
                }

                if (max_distance < tolerance) {
                    break;
                }

                sample_points.push_back(max_point);
            }
        }

        std::vector<double> parameters(points.size());
        std::vector<Vector> locations(points.size());

        for (Index i = 0; i < length(points); i++) {
            parameters[i] = std::get<0>(points[i]);
            locations[i] = std::get<1>(points[i]);
        }

        return {parameters, locations};
    }